

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_init.c
# Opt level: O2

void init_objects(void)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  objclass *poVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  short *psVar8;
  byte *pbVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  int o_high;
  short *psVar15;
  char *pcVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  
  for (lVar7 = 0; lVar7 != 0x12; lVar7 = lVar7 + 1) {
    bases[lVar7] = 0;
  }
  psVar8 = &objects->oc_descr_idx;
  for (lVar7 = 0; lVar7 != 0x21a; lVar7 = lVar7 + 1) {
    *psVar8 = (short)lVar7;
    ((objclass *)(psVar8 + -1))->oc_name_idx = (short)lVar7;
    psVar8 = psVar8 + 0x14;
  }
  uVar17 = 0;
  do {
    if (0x219 < (int)uVar17) {
      uVar19 = 1;
      do {
        if (uVar19 == 0x12) {
          shuffle(0x50,0x53,'\0');
          shuffle(0x8f,0x92,'\0');
          shuffle(0x84,0x87,'\0');
          shuffle(0x96,0x9c,'\0');
          for (iVar10 = 9; -1 < iVar10; iVar10 = iVar10 + -1) {
            iVar6 = rn2(iVar10 + 1);
            swap_armor(iVar10,iVar6,0x5f);
            swap_armor(iVar10,iVar6,0x54);
          }
          shuffle(bases[8],0x131,'\x01');
          shuffle(0x12d,0x13a,'\x01');
          shuffle(0x13b,0x14e,'\x01');
          shuffle(0x12d,0x142,'\x01');
          return;
        }
        iVar10 = bases[uVar19];
        lVar7 = (long)iVar10;
        iVar6 = 0x219;
        if (0x219 < iVar10) {
          iVar6 = iVar10;
        }
        iVar14 = iVar10 + -1;
        pcVar16 = &objects[lVar7 + 1].oc_class;
        lVar12 = lVar7;
        do {
          o_high = iVar6;
          if (0x218 < lVar12) break;
          lVar12 = lVar12 + 1;
          cVar1 = *pcVar16;
          iVar14 = iVar14 + 1;
          pcVar16 = pcVar16 + 0x28;
          o_high = iVar14;
        } while (uVar19 == (uint)(int)cVar1);
        if ((((uVar19 != 0xd) && (uVar19 != 8)) && (uVar19 != 3)) &&
           ((uVar17 = (uint)uVar19, (uVar17 & 0x1b) != 2 &&
            (obj_descr[objects[lVar7].oc_descr_idx].oc_descr != (char *)0x0)))) {
          if ((uVar17 < 0xb) && ((0x620U >> (uVar17 & 0x1f) & 1) != 0)) {
            lVar7 = (long)o_high;
            o_high = o_high + 1;
            pbVar9 = &objects[lVar7].field_0x10;
            do {
              bVar3 = *pbVar9;
              o_high = o_high + -1;
              pbVar9 = pbVar9 + -0x28;
            } while ((bVar3 & 0x50) != 0x10);
          }
          shuffle(iVar10,o_high,'\x01');
        }
        uVar19 = uVar19 + 1;
      } while( true );
    }
    lVar18 = (long)(int)uVar17;
    cVar1 = objects[lVar18].oc_class;
    lVar12 = 0;
    pcVar16 = &objects[lVar18 + 1].oc_class;
    lVar7 = (ulong)uVar17 << 0x20;
    do {
      lVar13 = lVar7;
      if (0x219 - lVar18 == lVar12) {
        uVar11 = 0x21a;
        goto LAB_001fc627;
      }
      lVar12 = lVar12 + 1;
      cVar2 = *pcVar16;
      pcVar16 = pcVar16 + 0x28;
      lVar7 = lVar13 + 0x100000000;
    } while (cVar2 == cVar1);
    uVar11 = (int)lVar12 + uVar17;
LAB_001fc627:
    bases[(int)cVar1] = uVar17;
    if (cVar1 == '\r') {
      setgemprobs((d_level *)0x0);
      uVar5 = mt_random();
      poVar4 = objects;
      if ((uVar5 & 1) != 0) {
        objects[0x1f7].oc_descr_idx = objects[500].oc_descr_idx;
        poVar4[0x1f7].oc_color = poVar4[500].oc_color;
      }
      uVar5 = mt_random();
      poVar4 = objects;
      if ((uVar5 & 1) != 0) {
        objects[0x1f9].oc_descr_idx = objects[500].oc_descr_idx;
        poVar4[0x1f9].oc_color = poVar4[500].oc_color;
      }
      uVar5 = mt_random();
      poVar4 = objects;
      switch(uVar5 & 3) {
      case 0:
        goto switchD_001fc6c0_caseD_0;
      case 1:
        lVar7 = 0x4e37;
        lVar12 = 0x4e22;
        break;
      case 2:
        lVar7 = 0x4dbf;
        lVar12 = 0x4daa;
        break;
      case 3:
        lVar7 = 0x4e87;
        lVar12 = 0x4e72;
      }
      objects[0x202].oc_descr_idx = *(short *)((long)&objects->oc_name_idx + lVar12);
      poVar4[0x202].oc_color = *(uchar *)((long)&poVar4->oc_name_idx + lVar7);
    }
switchD_001fc6c0_caseD_0:
    lVar13 = lVar13 >> 0x20;
    while( true ) {
      psVar15 = &objects[lVar18].oc_prob;
      iVar10 = 0;
      psVar8 = psVar15;
      for (lVar7 = lVar18; lVar7 <= lVar13; lVar7 = lVar7 + 1) {
        iVar10 = iVar10 + *psVar8;
        psVar8 = psVar8 + 0x14;
      }
      if (iVar10 != 0) break;
      iVar10 = 1000;
      for (lVar7 = lVar18; lVar7 <= lVar13; lVar7 = lVar7 + 1) {
        *psVar15 = (short)(iVar10 / (int)(uVar11 - uVar17));
        iVar10 = iVar10 + 1;
        psVar15 = psVar15 + 0x14;
      }
    }
    uVar17 = uVar11;
    if (iVar10 != 1000) {
      raw_printf("init-prob error for class %d (%d%%)\n",(ulong)(uint)(int)cVar1);
    }
  } while( true );
}

Assistant:

void init_objects(void)
{
	int i, first, last, sum;
	char oclass;

	/* bug fix to prevent "initialization error" abort on Intel Xenix.
	 * reported by mikew@semike
	 */
	for (i = 0; i < MAXOCLASSES; i++)
		bases[i] = 0;
	/* initialize object descriptions */
	for (i = 0; i < NUM_OBJECTS; i++)
		objects[i].oc_name_idx = objects[i].oc_descr_idx = i;
	/* init base; if probs given check that they add up to 1000,
	   otherwise compute probs */
	first = 0;
	while ( first < NUM_OBJECTS ) {
		oclass = objects[first].oc_class;
		last = first+1;
		while (last < NUM_OBJECTS && objects[last].oc_class == oclass) last++;
		bases[(int)oclass] = first;

		if (oclass == GEM_CLASS) {
			setgemprobs(NULL);

			if (rn2(2)) { /* change turquoise from green to blue? */
			    COPY_OBJ_DESCR(objects[TURQUOISE],objects[SAPPHIRE]);
			}
			if (rn2(2)) { /* change aquamarine from green to blue? */
			    COPY_OBJ_DESCR(objects[AQUAMARINE],objects[SAPPHIRE]);
			}
			switch (rn2(4)) { /* change fluorite from violet? */
			    case 0:  break;
			    case 1:	/* blue */
				COPY_OBJ_DESCR(objects[FLUORITE],objects[SAPPHIRE]);
				break;
			    case 2:	/* white */
				COPY_OBJ_DESCR(objects[FLUORITE],objects[DIAMOND]);
				break;
			    case 3:	/* green */
				COPY_OBJ_DESCR(objects[FLUORITE],objects[EMERALD]);
				break;
			}
		}
	check:
		sum = 0;
		for (i = first; i < last; i++) sum += objects[i].oc_prob;
		if (sum == 0) {
			for (i = first; i < last; i++)
			    objects[i].oc_prob = (1000+i-first)/(last-first);
			goto check;
		}
		if (sum != 1000)
			raw_printf("init-prob error for class %d (%d%%)\n", oclass, sum);
		
		first = last;
	}
	/* shuffle descriptions */
	shuffle_all();
}